

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

IGeneratorTracker * __thiscall
Catch::RunContext::createGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo lineInfo,
          GeneratorBasePtr *generator)

{
  ITracker *parent;
  bool bVar1;
  TrackerBase *this_00;
  int __oflag;
  GeneratorTracker *temp;
  unique_ptr<Catch::TestCaseTracking::ITracker> local_90;
  string local_88;
  NameAndLocation local_68;
  StringRef generatorName_local;
  
  generatorName_local.m_size = generatorName.m_size;
  generatorName_local.m_start = generatorName.m_start;
  StringRef::operator_cast_to_string(&local_88,&generatorName_local);
  local_68.name._M_string_length = local_88._M_string_length;
  local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    local_68.name.field_2._8_8_ = local_88.field_2._8_8_;
  }
  else {
    local_68.name._M_dataplus._M_p = local_88._M_dataplus._M_p;
  }
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68.location.file = lineInfo.file;
  local_68.location.line = lineInfo.line;
  std::__cxx11::string::~string((string *)&local_88);
  parent = (this->m_trackerContext).m_currentTracker;
  bVar1 = TestCaseTracking::operator!=(&parent->m_nameAndLocation,&local_68);
  if (bVar1) {
    this_00 = (TrackerBase *)operator_new(0x78);
    TestCaseTracking::TrackerBase::TrackerBase(this_00,&local_68,&this->m_trackerContext,parent);
    (this_00->super_ITracker)._vptr_ITracker = (_func_int **)&PTR__GeneratorTracker_002f6cf8;
    this_00[1].super_ITracker._vptr_ITracker = (_func_int **)&PTR__GeneratorTracker_002f6d58;
    this_00[1].super_ITracker.m_nameAndLocation.name._M_dataplus._M_p = (pointer)0x0;
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_90.m_ptr = (ITracker *)this_00;
    std::
    vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>
              ((vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
                *)&parent->m_children,&local_90);
    if ((TrackerBase *)local_90.m_ptr != (TrackerBase *)0x0) {
      (*((ITracker *)&(local_90.m_ptr)->_vptr_ITracker)->_vptr_ITracker[1])();
    }
    Detail::unique_ptr<Catch::Generators::GeneratorUntypedBase>::operator=
              ((unique_ptr<Catch::Generators::GeneratorUntypedBase> *)
               &this_00[1].super_ITracker.m_nameAndLocation,generator);
    TestCaseTracking::TrackerBase::open(this_00,(char *)generator,__oflag);
    Detail::unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker>::~unique_ptr
              ((unique_ptr<Catch::Generators::(anonymous_namespace)::GeneratorTracker> *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    return (IGeneratorTracker *)(this_00 + 1);
  }
  __assert_fail("currentTracker.nameAndLocation() != nameAndLoc && \"Trying to create tracker for a genreator that already has one\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x1524,
                "virtual IGeneratorTracker *Catch::RunContext::createGeneratorTracker(StringRef, SourceLineInfo, Generators::GeneratorBasePtr &&)"
               );
}

Assistant:

IGeneratorTracker* RunContext::createGeneratorTracker(
        StringRef generatorName,
        SourceLineInfo lineInfo,
        Generators::GeneratorBasePtr&& generator ) {

        auto nameAndLoc = TestCaseTracking::NameAndLocation( static_cast<std::string>( generatorName ), lineInfo );
        auto& currentTracker = m_trackerContext.currentTracker();
        assert(
            currentTracker.nameAndLocation() != nameAndLoc &&
            "Trying to create tracker for a genreator that already has one" );

        auto newTracker = Catch::Detail::make_unique<Generators::GeneratorTracker>(
            CATCH_MOVE(nameAndLoc), m_trackerContext, &currentTracker );
        auto ret = newTracker.get();
        currentTracker.addChild( CATCH_MOVE( newTracker ) );

        ret->setGenerator( CATCH_MOVE( generator ) );
        ret->open();
        return ret;
    }